

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

int __thiscall FNodeBuilder::MarkLoop(FNodeBuilder *this,DWORD firstseg,int loopnum)

{
  int iVar1;
  int iVar2;
  int iVar3;
  sector_t_conflict *psVar4;
  angle_t aVar5;
  angle_t aVar6;
  uint uVar7;
  FPrivSeg *pFVar8;
  FPrivVert *pFVar9;
  bool bVar10;
  angle_t angdiff;
  angle_t ang2;
  FPrivSeg *s2;
  angle_t ang1;
  angle_t bestang;
  DWORD tryseg;
  DWORD bestseg;
  FPrivSeg *s1;
  sector_t_conflict *sec;
  DWORD seg;
  int loopnum_local;
  DWORD firstseg_local;
  FNodeBuilder *this_local;
  
  pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                     (&this->Segs,(ulong)firstseg);
  psVar4 = pFVar8->frontsector;
  pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                     (&this->Segs,(ulong)firstseg);
  sec._4_4_ = firstseg;
  this_local._4_4_ = loopnum;
  if (pFVar8->loopnum == 0) {
    do {
      pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)sec._4_4_);
      pFVar8->loopnum = loopnum;
      bestang = 0xffffffff;
      pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar8->v2);
      ang1 = pFVar9->segs;
      s2._4_4_ = 0xffffffff;
      pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar8->v2);
      iVar1 = (pFVar9->super_FSimpleVert).x;
      pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar8->v1);
      iVar2 = (pFVar9->super_FSimpleVert).x;
      pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar8->v2);
      iVar3 = (pFVar9->super_FSimpleVert).y;
      pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar8->v1);
      aVar5 = PointToAngle(iVar1 - iVar2,iVar3 - (pFVar9->super_FSimpleVert).y);
      while (ang1 != 0xffffffff) {
        pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                           (&this->Segs,(ulong)ang1);
        if (pFVar8->frontsector == psVar4) {
          pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                             (&this->Vertices,(long)pFVar8->v1);
          iVar1 = (pFVar9->super_FSimpleVert).x;
          pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                             (&this->Vertices,(long)pFVar8->v2);
          iVar2 = (pFVar9->super_FSimpleVert).x;
          pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                             (&this->Vertices,(long)pFVar8->v1);
          iVar3 = (pFVar9->super_FSimpleVert).y;
          pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                             (&this->Vertices,(long)pFVar8->v2);
          aVar6 = PointToAngle(iVar1 - iVar2,iVar3 - (pFVar9->super_FSimpleVert).y);
          uVar7 = aVar6 - aVar5;
          if ((uVar7 < s2._4_4_) && (uVar7 != 0)) {
            bestang = ang1;
            s2._4_4_ = uVar7;
          }
        }
        ang1 = pFVar8->nextforvert;
      }
      sec._4_4_ = bestang;
      bVar10 = false;
      if (bestang != 0xffffffff) {
        pFVar8 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                           (&this->Segs,(ulong)bestang);
        bVar10 = pFVar8->loopnum == 0;
      }
    } while (bVar10);
    this_local._4_4_ = loopnum + 1;
  }
  return this_local._4_4_;
}

Assistant:

int FNodeBuilder::MarkLoop (DWORD firstseg, int loopnum)
{
	DWORD seg;
	sector_t *sec = Segs[firstseg].frontsector;

	if (Segs[firstseg].loopnum != 0)
	{ // already marked
		return loopnum;
	}

	seg = firstseg;

	do
	{
		FPrivSeg *s1 = &Segs[seg];

		s1->loopnum = loopnum;

		P(Printf ("Mark seg %d (%d,%d)-(%d,%d)\n", seg,
				Vertices[s1->v1].x>>16, Vertices[s1->v1].y>>16,
				Vertices[s1->v2].x>>16, Vertices[s1->v2].y>>16));

		DWORD bestseg = DWORD_MAX;
		DWORD tryseg = Vertices[s1->v2].segs;
		angle_t bestang = ANGLE_MAX;
		angle_t ang1 = PointToAngle (Vertices[s1->v2].x - Vertices[s1->v1].x,
			Vertices[s1->v2].y - Vertices[s1->v1].y);

		while (tryseg != DWORD_MAX)
		{
			FPrivSeg *s2 = &Segs[tryseg];

			if (s2->frontsector == sec)
			{
				angle_t ang2 = PointToAngle (Vertices[s2->v1].x - Vertices[s2->v2].x,
					Vertices[s2->v1].y - Vertices[s2->v2].y);
				angle_t angdiff = ang2 - ang1;

				if (angdiff < bestang && angdiff > 0)
				{
					bestang = angdiff;
					bestseg = tryseg;
				}
			}
			tryseg = s2->nextforvert;
		}

		seg = bestseg;
	} while (seg != DWORD_MAX && Segs[seg].loopnum == 0);

	return loopnum + 1;
}